

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

FuncDef * sqlite3VtabOverloadFunction(sqlite3 *db,FuncDef *pDef,int nArg,Expr *pExpr)

{
  Table *pTab_00;
  sqlite3_module *psVar1;
  char *__src;
  int iVar2;
  VTable *pVVar3;
  FuncDef *__dest;
  char *in_RCX;
  int in_EDX;
  FuncDef *in_RSI;
  sqlite3 *in_RDI;
  long in_FS_OFFSET;
  int rc;
  FuncDef *pNew;
  sqlite3_module *pMod;
  sqlite3_vtab *pVtab;
  Table *pTab;
  void *pArg;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xSFunc;
  char *in_stack_ffffffffffffff78;
  sqlite3 *in_stack_ffffffffffffff80;
  FuncDef *__dest_00;
  FuncDef *local_20;
  void *local_18;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0;
  local_18 = (void *)0x0;
  local_20 = in_RSI;
  if ((((in_RCX != (char *)0x0) && (*in_RCX == -0x58)) &&
      (pTab_00 = *(Table **)(in_RCX + 0x40), pTab_00 != (Table *)0x0)) &&
     (pTab_00->eTabType == '\x01')) {
    pVVar3 = sqlite3GetVTable(in_RDI,pTab_00);
    psVar1 = pVVar3->pVtab->pModule;
    if ((psVar1->xFindFunction !=
         (_func_int_sqlite3_vtab_ptr_int_char_ptr_anon_subr_ptr_ptr_void_ptr_ptr *)0x0) &&
       (iVar2 = (*psVar1->xFindFunction)(pVVar3->pVtab,in_EDX,in_RSI->zName,&local_10,&local_18),
       iVar2 != 0)) {
      sqlite3Strlen30(in_stack_ffffffffffffff78);
      __dest = (FuncDef *)
               sqlite3DbMallocZero(in_stack_ffffffffffffff80,(u64)in_stack_ffffffffffffff78);
      if (__dest != (FuncDef *)0x0) {
        memcpy(__dest,in_RSI,0x48);
        __dest->zName = (char *)(__dest + 1);
        __dest_00 = __dest + 1;
        __src = in_RSI->zName;
        iVar2 = sqlite3Strlen30(in_stack_ffffffffffffff78);
        memcpy(__dest_00,__src,(long)(iVar2 + 1));
        __dest->xSFunc = local_10;
        __dest->pUserData = local_18;
        __dest->funcFlags = __dest->funcFlags | 0x10;
        local_20 = __dest;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_20;
}

Assistant:

SQLITE_PRIVATE FuncDef *sqlite3VtabOverloadFunction(
  sqlite3 *db,    /* Database connection for reporting malloc problems */
  FuncDef *pDef,  /* Function to possibly overload */
  int nArg,       /* Number of arguments to the function */
  Expr *pExpr     /* First argument to the function */
){
  Table *pTab;
  sqlite3_vtab *pVtab;
  sqlite3_module *pMod;
  void (*xSFunc)(sqlite3_context*,int,sqlite3_value**) = 0;
  void *pArg = 0;
  FuncDef *pNew;
  int rc = 0;

  /* Check to see the left operand is a column in a virtual table */
  if( NEVER(pExpr==0) ) return pDef;
  if( pExpr->op!=TK_COLUMN ) return pDef;
  assert( ExprUseYTab(pExpr) );
  pTab = pExpr->y.pTab;
  if( NEVER(pTab==0) ) return pDef;
  if( !IsVirtual(pTab) ) return pDef;
  pVtab = sqlite3GetVTable(db, pTab)->pVtab;
  assert( pVtab!=0 );
  assert( pVtab->pModule!=0 );
  pMod = (sqlite3_module *)pVtab->pModule;
  if( pMod->xFindFunction==0 ) return pDef;

  /* Call the xFindFunction method on the virtual table implementation
  ** to see if the implementation wants to overload this function.
  **
  ** Though undocumented, we have historically always invoked xFindFunction
  ** with an all lower-case function name.  Continue in this tradition to
  ** avoid any chance of an incompatibility.
  */
#ifdef SQLITE_DEBUG
  {
    int i;
    for(i=0; pDef->zName[i]; i++){
      unsigned char x = (unsigned char)pDef->zName[i];
      assert( x==sqlite3UpperToLower[x] );
    }
  }
#endif
  rc = pMod->xFindFunction(pVtab, nArg, pDef->zName, &xSFunc, &pArg);
  if( rc==0 ){
    return pDef;
  }

  /* Create a new ephemeral function definition for the overloaded
  ** function */
  pNew = sqlite3DbMallocZero(db, sizeof(*pNew)
                             + sqlite3Strlen30(pDef->zName) + 1);
  if( pNew==0 ){
    return pDef;
  }
  *pNew = *pDef;
  pNew->zName = (const char*)&pNew[1];
  memcpy((char*)&pNew[1], pDef->zName, sqlite3Strlen30(pDef->zName)+1);
  pNew->xSFunc = xSFunc;
  pNew->pUserData = pArg;
  pNew->funcFlags |= SQLITE_FUNC_EPHEM;
  return pNew;
}